

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

int LzmaDec_DecodeReal2(CLzmaDec *p,SizeT limit,Byte *bufLimit)

{
  int iVar1;
  Byte *in_RDX;
  ulong in_RSI;
  CLzmaDec *in_RDI;
  bool bVar2;
  int __result__;
  UInt32 rem;
  SizeT limit2;
  Byte *in_stack_000000a8;
  SizeT in_stack_000000b0;
  CLzmaDec *in_stack_000000b8;
  
  do {
    iVar1 = LzmaDec_DecodeReal(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
    if (iVar1 != 0) {
      return iVar1;
    }
    if ((in_RDI->checkDicSize == 0) && ((in_RDI->prop).dicSize <= in_RDI->processedPos)) {
      in_RDI->checkDicSize = (in_RDI->prop).dicSize;
    }
    LzmaDec_WriteRem(in_RDI,in_RSI);
    bVar2 = false;
    if ((in_RDI->dicPos < in_RSI) && (bVar2 = false, in_RDI->buf < in_RDX)) {
      bVar2 = in_RDI->remainLen < 0x112;
    }
  } while (bVar2);
  if (0x112 < in_RDI->remainLen) {
    in_RDI->remainLen = 0x112;
  }
  return 0;
}

Assistant:

static int MY_FAST_CALL LzmaDec_DecodeReal2(CLzmaDec *p, SizeT limit, const Byte *bufLimit)
{
  do
  {
    SizeT limit2 = limit;
    if (p->checkDicSize == 0)
    {
      UInt32 rem = p->prop.dicSize - p->processedPos;
      if (limit - p->dicPos > rem)
        limit2 = p->dicPos + rem;
    }
    
    RINOK(LzmaDec_DecodeReal(p, limit2, bufLimit));
    
    if (p->checkDicSize == 0 && p->processedPos >= p->prop.dicSize)
      p->checkDicSize = p->prop.dicSize;
    
    LzmaDec_WriteRem(p, limit);
  }
  while (p->dicPos < limit && p->buf < bufLimit && p->remainLen < kMatchSpecLenStart);

  if (p->remainLen > kMatchSpecLenStart)
    p->remainLen = kMatchSpecLenStart;

  return 0;
}